

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O2

int_mv av1_simple_motion_search_sse_var
                 (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int ref,
                 FULLPEL_MV start_mv,int num_planes,int use_subpixel,uint *sse,uint *var)

{
  AV1_COMMON *cm;
  uint8_t uVar1;
  byte bVar2;
  char cVar3;
  undefined1 uVar4;
  MB_MODE_INFO *pMVar5;
  MACROBLOCKD *xd;
  SEARCH_METHODS search_method;
  int mi_ext_col;
  int iVar6;
  RefCntBuffer *pRVar7;
  YV12_BUFFER_CONFIG *src;
  scale_factors *psVar8;
  search_site_config *search_sites;
  BLOCK_SIZE BVar9;
  int iVar10;
  uint plane_end;
  int iVar11;
  int *cost_list_00;
  ulong uVar12;
  MV_REFERENCE_FRAME MVar13;
  long lVar14;
  YV12_BUFFER_CONFIG *src_00;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined7 in_register_00000081;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  bool bVar21;
  int_mv best_mv;
  MACROBLOCKD *local_260;
  ulong local_258;
  uint local_250;
  MV ref_mv;
  FULLPEL_MV_STATS best_mv_stats;
  int not_used;
  buf_2d backup_yv12;
  int cost_list [5];
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  
  local_258 = (ulong)(uint)mi_col;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  uVar12 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar20 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar12];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar12];
  iVar11 = (cpi->common).mi_params.mi_stride;
  iVar16 = iVar11 * mi_row + mi_col;
  iVar10 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [(cpi->common).mi_params.mi_alloc_bsize];
  iVar6 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  (cpi->common).mi_params.mi_grid_base[iVar16] =
       (cpi->common).mi_params.mi_alloc + ((cpi->common).mi_params.mi_alloc_stride * iVar10 + iVar6)
  ;
  (x->e_mbd).mi = (cpi->common).mi_params.mi_grid_base + iVar16;
  (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar16;
  (x->e_mbd).tx_type_map_stride = iVar11;
  x->mbmi_ext_frame =
       (cpi->mbmi_ext_info).frame_base + (iVar10 * (cpi->mbmi_ext_info).stride + iVar6);
  plane_end = (uint)(uVar1 == '\0') * 2 + 1;
  local_260 = (MACROBLOCKD *)(ulong)plane_end;
  cm = &cpi->common;
  lVar14 = 0;
  av1_setup_dst_planes
            ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
  iVar11 = (cpi->oxcf).border_in_pixels;
  iVar10 = 8 - (iVar11 + mi_row * 4);
  iVar6 = ((uint)bVar2 + mi_row) * -4 + -8;
  if (iVar6 < iVar10) {
    iVar6 = iVar10;
  }
  (x->mv_limits).row_min = iVar6;
  iVar10 = (cpi->common).mi_params.mi_rows;
  iVar16 = iVar10 - mi_row;
  iVar6 = iVar16 * 4 + 8;
  iVar16 = iVar11 + (iVar16 - (uint)bVar2) * 4 + -8;
  if (iVar16 < iVar6) {
    iVar6 = iVar16;
  }
  (x->mv_limits).row_max = iVar6;
  iVar6 = (int)local_258;
  iVar15 = 8 - (iVar11 + iVar6 * 4);
  iVar16 = ((uint)bVar20 + iVar6) * -4 + -8;
  if (iVar16 < iVar15) {
    iVar16 = iVar15;
  }
  (x->mv_limits).col_min = iVar16;
  iVar15 = (cpi->common).mi_params.mi_cols;
  iVar17 = iVar15 - iVar6;
  iVar16 = iVar17 * 4 + 8;
  iVar11 = iVar11 + (iVar17 - (uint)bVar20) * 4 + -8;
  if (iVar11 < iVar16) {
    iVar16 = iVar11;
  }
  (x->mv_limits).col_max = iVar16;
  for (; (long)local_260 * 0xa30 - lVar14 != 0; lVar14 = lVar14 + 0xa30) {
    bVar18 = (byte)(((uint)bVar2 << 2) >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar14 + -0x28) & 0x1f));
    bVar19 = (byte)(((uint)bVar20 << 2) >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar14 + -0x2c) & 0x1f));
    if (bVar19 < 5) {
      bVar19 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar14 + 0x90) = bVar19;
    if (bVar18 < 5) {
      bVar18 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar14 + 0x91) = bVar18;
  }
  (x->e_mbd).mi_row = mi_row;
  (x->e_mbd).mi_col = iVar6;
  (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
  (x->e_mbd).mb_to_bottom_edge = (iVar10 - ((uint)bVar2 + mi_row)) * 0x20;
  (x->e_mbd).mb_to_left_edge = iVar6 * -0x20;
  (x->e_mbd).mb_to_right_edge = (iVar15 - ((uint)bVar20 + iVar6)) * 0x20;
  av1_setup_src_planes(x,cpi->source,mi_row,iVar6,(int)local_260,bsize);
  pMVar5 = *(x->e_mbd).mi;
  pMVar5->bsize = bsize;
  pMVar5->ref_frame[0] = (char)ref;
  pMVar5->ref_frame[1] = -1;
  pMVar5->motion_mode = '\0';
  (pMVar5->interp_filters).as_int = 0;
  bVar20 = (char)ref - 1;
  if ((bVar20 < 8) &&
     (lVar14 = (long)(cpi->common).remapped_ref_idx[(ref & 0xffU) - 1], lVar14 != -1)) {
    pRVar7 = (cpi->common).ref_frame_map[lVar14];
  }
  else {
    pRVar7 = (RefCntBuffer *)0x0;
  }
  local_260 = &x->e_mbd;
  src_00 = &pRVar7->buf;
  if (pRVar7 == (RefCntBuffer *)0x0) {
    src_00 = (YV12_BUFFER_CONFIG *)0x0;
  }
  local_250 = (uint)CONCAT71(in_register_00000081,bsize) & 0xff;
  src = av1_get_scaled_ref_frame(cpi,ref);
  ref_mv.row = 0;
  ref_mv.col = 0;
  iVar6 = (cpi->sf).part_sf.simple_motion_search_reduce_search_steps +
          (cpi->mv_search_params).mv_step_param;
  iVar11 = 9;
  if (iVar6 < 9) {
    iVar11 = iVar6;
  }
  if ((bVar20 < 8) && (iVar6 = (cpi->common).remapped_ref_idx[(ref & 0xffU) - 1], iVar6 != -1)) {
    psVar8 = (cpi->common).ref_scale_factors + iVar6;
  }
  else {
    psVar8 = (scale_factors *)0x0;
  }
  av1_setup_pre_planes(local_260,0,src_00,mi_row,(int)local_258,psVar8,num_planes);
  uVar4 = pMVar5->ref_frame[0];
  cVar3 = pMVar5->ref_frame[1];
  MVar13 = uVar4;
  if ((char)uVar4 < '\x02') {
    MVar13 = '\x01';
  }
  psVar8 = get_ref_scale_factors_const(cm,MVar13);
  (x->e_mbd).block_ref_scale_factors[0] = psVar8;
  MVar13 = '\x01';
  if ('\x01' < cVar3) {
    MVar13 = cVar3;
  }
  psVar8 = get_ref_scale_factors_const(cm,MVar13);
  (x->e_mbd).block_ref_scale_factors[1] = psVar8;
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    backup_yv12.buf = (x->e_mbd).plane[0].pre[0].buf;
    backup_yv12.buf0 = (x->e_mbd).plane[0].pre[0].buf0;
    backup_yv12.width = (x->e_mbd).plane[0].pre[0].width;
    backup_yv12.height = (x->e_mbd).plane[0].pre[0].height;
    backup_yv12.stride = (x->e_mbd).plane[0].pre[0].stride;
    backup_yv12._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c;
    av1_setup_pre_planes(local_260,0,src,mi_row,(int)local_258,(scale_factors *)0x0,num_planes);
  }
  iVar6 = use_fine_search_interval(cpi);
  BVar9 = (BLOCK_SIZE)local_250;
  search_method = av1_get_default_mv_search_method(x,&(cpi->sf).mv_sf,BVar9);
  search_sites = av1_get_search_site_config(cpi,x,search_method);
  av1_make_default_fullpel_ms_params
            (&full_ms_params,cpi,x,BVar9,&ref_mv,start_mv,search_sites,search_method,iVar6);
  if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
    cost_list_00 = (int *)0x0;
  }
  else {
    cost_list_00 = cost_list;
    if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
      cost_list_00 = (int *)0x0;
    }
  }
  iVar11 = av1_full_pixel_search
                     (start_mv,&full_ms_params,iVar11,cost_list_00,&best_mv.as_fullmv,&best_mv_stats
                      ,(FULLPEL_MV *)0x0);
  if (iVar11 == 0x7fffffff) {
    bVar21 = false;
  }
  else {
    bVar21 = false;
    if ((use_subpixel != 0) && ((cpi->common).features.cur_frame_force_integer_mv == false)) {
      bVar21 = (cpi->sf).mv_sf.simple_motion_subpel_force_stop != '\x03';
    }
  }
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    (x->e_mbd).plane[0].pre[0].width = backup_yv12.width;
    (x->e_mbd).plane[0].pre[0].height = backup_yv12.height;
    (x->e_mbd).plane[0].pre[0].stride = backup_yv12.stride;
    *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c = backup_yv12._28_4_;
    (x->e_mbd).plane[0].pre[0].buf = backup_yv12.buf;
    (x->e_mbd).plane[0].pre[0].buf0 = backup_yv12.buf0;
  }
  if (bVar21) {
    not_used = 0;
    BVar9 = (BLOCK_SIZE)local_250;
    av1_make_default_subpel_ms_params(&ms_params,cpi,x,BVar9,&ref_mv,cost_list);
    xd = local_260;
    ms_params.forced_stop = (cpi->sf).mv_sf.simple_motion_subpel_force_stop;
    (*(cpi->mv_search_params).find_fractional_mv_step)
              (local_260,cm,&ms_params,
               (MV)((best_mv.as_int >> 0x10) * 0x80000 + (best_mv.as_int & 0x1fff) * 8),
               &best_mv_stats,(MV *)&best_mv,&not_used,x->pred_sse + ref,(int_mv *)0x0);
    pMVar5->mv[0] = best_mv;
    av1_enc_build_inter_predictor(cm,xd,mi_row,(int)local_258,(BUFFER_SET *)0x0,BVar9,0,0);
    best_mv_stats.sse =
         (*cpi->ppi->fn_ptr[uVar12].vf)
                   (x->plane[0].src.buf,x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
                    (x->e_mbd).plane[0].dst.stride,sse);
  }
  else {
    convert_fullmv_to_mv(&best_mv);
    *var = best_mv_stats.distortion;
    var = sse;
  }
  *var = best_mv_stats.sse;
  return (int_mv)best_mv.as_int;
}

Assistant:

int_mv av1_simple_motion_search_sse_var(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        BLOCK_SIZE bsize, int ref,
                                        FULLPEL_MV start_mv, int num_planes,
                                        int use_subpixel, unsigned int *sse,
                                        unsigned int *var) {
  assert(num_planes == 1 &&
         "Currently simple_motion_search only supports luma plane");
  assert(!frame_is_intra_only(&cpi->common) &&
         "Simple motion search only enabled for non-key frames");
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;

  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->bsize = bsize;
  mbmi->ref_frame[0] = ref;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->interp_filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, ref);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  struct buf_2d backup_yv12;
  // ref_mv is used to calculate the cost of the motion vector
  const MV ref_mv = kZeroMv;
  const int step_param =
      AOMMIN(cpi->mv_search_params.mv_step_param +
                 cpi->sf.part_sf.simple_motion_search_reduce_search_steps,
             MAX_MVSEARCH_STEPS - 2);
  int cost_list[5];
  const int ref_idx = 0;
  int bestsme;
  int_mv best_mv;
  FULLPEL_MV_STATS best_mv_stats;

  av1_setup_pre_planes(xd, ref_idx, yv12, mi_row, mi_col,
                       get_ref_scale_factors(cm, ref), num_planes);
  set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
  if (scaled_ref_frame) {
    backup_yv12 = xd->plane[AOM_PLANE_Y].pre[ref_idx];
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize, &ref_mv,
                                     start_mv, src_search_sites, search_method,
                                     fine_search_interval);

  bestsme = av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list),
                                  &best_mv.as_fullmv, &best_mv_stats, NULL);

  const int use_subpel_search =
      bestsme < INT_MAX && !cpi->common.features.cur_frame_force_integer_mv &&
      use_subpixel &&
      (cpi->sf.mv_sf.simple_motion_subpel_force_stop != FULL_PEL);
  if (scaled_ref_frame) {
    xd->plane[AOM_PLANE_Y].pre[ref_idx] = backup_yv12;
  }
  if (use_subpel_search) {
    int not_used = 0;

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    // TODO(yunqing): integrate this into av1_make_default_subpel_ms_params().
    ms_params.forced_stop = mv_sf->simple_motion_subpel_force_stop;

    MV subpel_start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &best_mv.as_mv,
        &not_used, &x->pred_sse[ref], NULL);

    mbmi->mv[0] = best_mv;

    // Get a copy of the prediction output
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
    *var = cpi->ppi->fn_ptr[bsize].vf(
        x->plane[0].src.buf, x->plane[0].src.stride, xd->plane[0].dst.buf,
        xd->plane[0].dst.stride, sse);
  } else {
    // Manually convert from units of pixel to 1/8-pixels if we are not doing
    // subpel search
    convert_fullmv_to_mv(&best_mv);
    *var = best_mv_stats.distortion;
    *sse = best_mv_stats.sse;
  }

  return best_mv;
}